

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

UEnumeration * ures_getKeywordValues_63(char *path,char *keyword,UErrorCode *status)

{
  int iVar1;
  UEnumeration *pUVar2;
  char *pcVar3;
  UResourceBundle *resB;
  size_t sVar4;
  long lVar5;
  long lVar6;
  UResourceBundle *pUVar7;
  ulong uVar8;
  ulong uVar9;
  UErrorCode subStatus;
  int32_t locLen;
  UResourceBundle item;
  UResourceBundle subItem;
  char valuesBuf [2048];
  char *valuesList [512];
  UErrorCode local_19f0;
  uint local_19ec;
  ulong local_19e8;
  UErrorCode *local_19e0;
  UEnumeration *local_19d8;
  uint local_19d0;
  int32_t local_19cc;
  UResourceBundle local_19c8;
  UResourceBundle local_1900;
  char local_1838 [2048];
  undefined8 auStack_1038 [513];
  
  memset(&local_19c8,0,200);
  memset(&local_1900,0,200);
  pUVar2 = ures_openAvailableLocales_63(path,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_19e8 = 0;
    local_1838[0] = '\0';
    local_1838[1] = '\0';
    pcVar3 = uenum_next_63(pUVar2,&local_19cc,status);
    if (pcVar3 != (char *)0x0) {
      local_19e8 = 0;
      local_19ec = 0;
      local_19e0 = status;
      local_19d8 = pUVar2;
      do {
        local_19f0 = U_ZERO_ERROR;
        resB = ures_openWithType((UResourceBundle *)0x0,path,pcVar3,URES_OPEN_DIRECT,&local_19f0);
        ures_getByKey_63(resB,keyword,&local_19c8,&local_19f0);
        if (resB != (UResourceBundle *)0x0) {
          if (local_19f0 < U_ILLEGAL_ARGUMENT_ERROR) {
LAB_002e729a:
            do {
              pUVar7 = ures_getNextResource_63(&local_19c8,&local_1900,&local_19f0);
              if ((pUVar7 == (UResourceBundle *)0x0) || (U_ZERO_ERROR < local_19f0))
              goto LAB_002e72c1;
              pcVar3 = pUVar7->fKey;
            } while ((pcVar3 == (char *)0x0) ||
                    (((*pcVar3 == '\0' || (iVar1 = strcmp(pcVar3,"default"), iVar1 == 0)) ||
                     (iVar1 = strncmp(pcVar3,"private-",8), iVar1 == 0))));
            if ((int)local_19ec < 1) {
LAB_002e7218:
              sVar4 = strlen(pcVar3);
              iVar1 = (int)sVar4 + (int)local_19e8;
              if (iVar1 < 0x7fe) {
                local_19d0 = iVar1 + 1;
                lVar5 = (long)(int)local_19e8;
                strcpy(local_1838 + lVar5,pcVar3);
                lVar6 = (long)(int)local_19ec;
                local_19ec = local_19ec + 1;
                auStack_1038[lVar6] = local_1838 + lVar5;
                local_1838[iVar1] = '\0';
                local_19e8 = (ulong)local_19d0;
                pUVar2 = local_19d8;
                status = local_19e0;
                goto LAB_002e729a;
              }
            }
            else {
              uVar8 = (ulong)local_19ec;
              uVar9 = 0;
              do {
                iVar1 = strcmp((char *)auStack_1038[uVar9],pcVar3);
                pUVar2 = local_19d8;
                status = local_19e0;
                if (iVar1 == 0) goto LAB_002e729a;
                uVar9 = uVar9 + 1;
              } while (uVar8 != uVar9);
              if ((int)local_19ec < 0x1ff) goto LAB_002e7218;
            }
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            pUVar2 = local_19d8;
            goto LAB_002e729a;
          }
LAB_002e72c1:
          ures_closeBundle(resB,'\x01');
        }
        pcVar3 = uenum_next_63(pUVar2,&local_19cc,status);
      } while (pcVar3 != (char *)0x0);
    }
    iVar1 = (int)local_19e8;
    local_1838[iVar1] = '\0';
    ures_closeBundle(&local_19c8,'\x01');
    ures_closeBundle(&local_1900,'\x01');
    uenum_close_63(pUVar2);
    pUVar2 = uloc_openKeywordList_63(local_1838,iVar1 + 1,status);
  }
  else {
    ures_closeBundle(&local_19c8,'\x01');
    ures_closeBundle(&local_1900,'\x01');
    pUVar2 = (UEnumeration *)0x0;
  }
  return pUVar2;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
ures_getKeywordValues(const char *path, const char *keyword, UErrorCode *status)
{
#define VALUES_BUF_SIZE 2048
#define VALUES_LIST_SIZE 512
    
    char       valuesBuf[VALUES_BUF_SIZE];
    int32_t    valuesIndex = 0;
    const char *valuesList[VALUES_LIST_SIZE];
    int32_t    valuesCount = 0;
    
    const char *locale;
    int32_t     locLen;
    
    UEnumeration *locs = NULL;
    
    UResourceBundle    item;
    UResourceBundle    subItem;
    
    ures_initStackObject(&item);
    ures_initStackObject(&subItem);
    locs = ures_openAvailableLocales(path, status);
    
    if(U_FAILURE(*status)) {
        ures_close(&item);
        ures_close(&subItem);
        return NULL;
    }
    
    valuesBuf[0]=0;
    valuesBuf[1]=0;
    
    while((locale = uenum_next(locs, &locLen, status)) != 0) {
        UResourceBundle   *bund = NULL;
        UResourceBundle   *subPtr = NULL;
        UErrorCode subStatus = U_ZERO_ERROR; /* don't fail if a bundle is unopenable */
        bund = ures_openDirect(path, locale, &subStatus);
        
#if defined(URES_TREE_DEBUG)
        if(!bund || U_FAILURE(subStatus)) {
            fprintf(stderr, "%s-%s values: Can't open %s locale - skipping. (%s)\n", 
                path?path:"<ICUDATA>", keyword, locale, u_errorName(subStatus));
        }
#endif
        
        ures_getByKey(bund, keyword, &item, &subStatus);
        
        if(!bund || U_FAILURE(subStatus)) {
#if defined(URES_TREE_DEBUG)
            fprintf(stderr, "%s-%s values: Can't find in %s - skipping. (%s)\n", 
                path?path:"<ICUDATA>", keyword, locale, u_errorName(subStatus));
#endif
            ures_close(bund);
            bund = NULL;
            continue;
        }
        
        while((subPtr = ures_getNextResource(&item,&subItem,&subStatus)) != 0
            && U_SUCCESS(subStatus)) {
            const char *k;
            int32_t i;
            k = ures_getKey(subPtr);

#if defined(URES_TREE_DEBUG)
            /* fprintf(stderr, "%s | %s | %s | %s\n", path?path:"<ICUDATA>", keyword, locale, k); */
#endif
            if(k == NULL || *k == 0 ||
                    uprv_strcmp(k, DEFAULT_TAG) == 0 || uprv_strncmp(k, "private-", 8) == 0) {
                // empty or "default" or unlisted type
                continue;
            }
            for(i=0; i<valuesCount; i++) {
                if(!uprv_strcmp(valuesList[i],k)) {
                    k = NULL; /* found duplicate */
                    break;
                }
            }
            if(k != NULL) {
                int32_t kLen = (int32_t)uprv_strlen(k);
                if((valuesCount >= (VALUES_LIST_SIZE-1)) ||       /* no more space in list .. */
                    ((valuesIndex+kLen+1+1) >= VALUES_BUF_SIZE)) { /* no more space in buffer (string + 2 nulls) */
                    *status = U_ILLEGAL_ARGUMENT_ERROR; /* out of space.. */
                } else {
                    uprv_strcpy(valuesBuf+valuesIndex, k);
                    valuesList[valuesCount++] = valuesBuf+valuesIndex;
                    valuesIndex += kLen;
#if defined(URES_TREE_DEBUG)
                    fprintf(stderr, "%s | %s | %s | [%s]   (UNIQUE)\n",
                        path?path:"<ICUDATA>", keyword, locale, k);
#endif
                    valuesBuf[valuesIndex++] = 0; /* terminate */
                }
            }
        }
        ures_close(bund);
    }
    valuesBuf[valuesIndex++] = 0; /* terminate */
    
    ures_close(&item);
    ures_close(&subItem);
    uenum_close(locs);
#if defined(URES_TREE_DEBUG)
    fprintf(stderr, "%s:  size %d, #%d\n", u_errorName(*status), 
        valuesIndex, valuesCount);
#endif
    return uloc_openKeywordList(valuesBuf, valuesIndex, status);
}